

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O1

bool __thiscall
cmAddCustomCommandCommand::InitialPass
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  long *plVar2;
  cmMakefile *this_00;
  pointer pbVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  pointer pbVar9;
  char *pcVar10;
  cmSourceFile *pcVar11;
  cmCustomCommand *pcVar12;
  ostream *poVar13;
  int iVar14;
  ulong uVar15;
  PolicyID id;
  MessageType t;
  value_type *__x;
  ulong uVar16;
  CustomCommandType type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  pointer pbVar18;
  bool bVar19;
  string filename;
  char *local_380;
  cmCustomCommandLine currentLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string working;
  string target;
  ImplicitDependsList implicit_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  ulong local_278;
  string source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string dep_1;
  string implicit_depends_lang;
  string comment_buffer;
  string main_dependency;
  string dep;
  ios_base local_138 [264];
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x80) {
    dep._M_dataplus._M_p = (pointer)&dep.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dep,"called with wrong number of arguments.","");
    cmCommand::SetError(&this->super_cmCommand,&dep);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dep._M_dataplus._M_p != &dep.field_2) {
      operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  source._M_dataplus._M_p = (pointer)&source.field_2;
  uVar16 = 0;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  main_dependency._M_dataplus._M_p = (pointer)&main_dependency.field_2;
  main_dependency._M_string_length = 0;
  main_dependency.field_2._M_local_buf[0] = '\0';
  working._M_dataplus._M_p = (pointer)&working.field_2;
  working._M_string_length = 0;
  working.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicit_depends_lang._M_dataplus._M_p = (pointer)&implicit_depends_lang.field_2;
  implicit_depends_lang._M_string_length = 0;
  implicit_depends_lang.field_2._M_local_buf[0] = '\0';
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar19 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish == pbVar9;
  bVar6 = !bVar19;
  if (bVar19) {
    bVar4 = true;
    type = POST_BUILD;
    bVar19 = false;
    local_380 = (char *)0x0;
  }
  else {
    type = POST_BUILD;
    iVar14 = 0xc;
    local_380 = (char *)0x0;
    bVar5 = 0;
    bVar19 = false;
    local_278 = 0;
    do {
      __x = pbVar9 + uVar16;
      iVar7 = std::__cxx11::string::compare((char *)__x);
      bVar4 = true;
      if (iVar7 == 0) {
        iVar14 = 0;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)__x);
        if (iVar7 == 0) {
          if (currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar14 = 1;
            goto LAB_00260063;
          }
          iVar14 = 1;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     &currentLine);
          pbVar3 = currentLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = currentLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar17 = &(currentLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar17 + -1))->_M_dataplus)._M_p;
              if (paVar17 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar17->_M_allocated_capacity + 1);
              }
              pbVar18 = (pointer)(paVar17 + 1);
              paVar17 = paVar17 + 2;
            } while (pbVar18 != pbVar3);
            currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)__x);
          if (iVar7 == 0) {
            type = PRE_BUILD;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)__x);
            if (iVar7 == 0) {
              type = PRE_LINK;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)__x);
              if (iVar7 == 0) {
                type = POST_BUILD;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)__x);
                if (iVar7 == 0) {
                  bVar4 = true;
                  bVar5 = 1;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)__x);
                  if (iVar7 == 0) {
                    bVar4 = true;
                    bVar19 = true;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)__x);
                    if (iVar7 == 0) {
                      bVar4 = true;
                      local_278 = 1;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)__x);
                      bVar4 = true;
                      if (iVar7 == 0) {
                        iVar14 = 2;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)__x);
                        if (iVar7 == 0) goto LAB_002600a0;
                        iVar7 = std::__cxx11::string::compare((char *)__x);
                        if (iVar7 == 0) {
                          iVar14 = 3;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)__x);
                          if (iVar7 == 0) {
                            iVar14 = 8;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare((char *)__x);
                            if (iVar7 == 0) {
                              iVar14 = 7;
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare((char *)__x);
                              if (iVar7 == 0) {
                                iVar14 = 9;
                              }
                              else {
                                iVar7 = std::__cxx11::string::compare((char *)__x);
                                if (iVar7 == 0) {
                                  iVar14 = 0xb;
                                }
                                else {
                                  iVar7 = std::__cxx11::string::compare((char *)__x);
                                  if (iVar7 == 0) {
                                    iVar14 = 6;
                                  }
                                  else {
                                    iVar7 = std::__cxx11::string::compare((char *)__x);
                                    if (iVar7 == 0) {
                                      iVar14 = 4;
                                    }
                                    else {
                                      iVar7 = std::__cxx11::string::compare((char *)__x);
                                      if (iVar7 != 0) {
                                        filename._M_dataplus._M_p = (pointer)&filename.field_2;
                                        filename._M_string_length = 0;
                                        filename.field_2._M_local_buf[0] = '\0';
                                        if (iVar14 - 7U < 3) {
                                          bVar4 = cmsys::SystemTools::FileIsFullPath
                                                            ((__x->_M_dataplus)._M_p);
                                          if (!bVar4) {
                                            pcVar10 = cmMakefile::GetCurrentBinaryDirectory
                                                                ((this->super_cmCommand).Makefile);
                                            std::__cxx11::string::operator=
                                                      ((string *)&filename,pcVar10);
                                            std::__cxx11::string::append((char *)&filename);
                                          }
                                          std::__cxx11::string::_M_append
                                                    ((char *)&filename,
                                                     (ulong)(__x->_M_dataplus)._M_p);
                                          cmsys::SystemTools::ConvertToUnixSlashes(&filename);
                                        }
                                        bVar4 = cmsys::SystemTools::FileIsFullPath
                                                          (filename._M_dataplus._M_p);
                                        if (bVar4) {
                                          cmsys::SystemTools::CollapseFullPath(&dep,&filename);
                                          std::__cxx11::string::operator=
                                                    ((string *)&filename,(string *)&dep);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)dep._M_dataplus._M_p != &dep.field_2) {
                                            operator_delete(dep._M_dataplus._M_p,
                                                            dep.field_2._M_allocated_capacity + 1);
                                          }
                                        }
                                        switch(iVar14) {
                                        case 0:
                                          std::__cxx11::string::_M_assign((string *)&source);
                                          bVar4 = true;
                                          iVar14 = 0;
                                          break;
                                        case 1:
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&currentLine.
                                                                                                              
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ,__x);
                                          bVar4 = true;
                                          iVar14 = 1;
                                          break;
                                        case 2:
                                          std::__cxx11::string::_M_assign((string *)&target);
                                          bVar4 = true;
                                          iVar14 = 2;
                                          break;
                                        case 3:
                                          dep._M_dataplus._M_p = (pointer)&dep.field_2;
                                          pcVar1 = (__x->_M_dataplus)._M_p;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&dep,pcVar1,
                                                     pcVar1 + __x->_M_string_length);
                                          cmsys::SystemTools::ConvertToUnixSlashes(&dep);
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&depends,&dep);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)dep._M_dataplus._M_p != &dep.field_2) {
                                            operator_delete(dep._M_dataplus._M_p,
                                                            dep.field_2._M_allocated_capacity + 1);
                                          }
                                          bVar4 = true;
                                          iVar14 = 3;
                                          break;
                                        case 4:
                                          std::__cxx11::string::_M_assign
                                                    ((string *)&implicit_depends_lang);
                                          bVar4 = true;
                                          iVar14 = 5;
                                          break;
                                        case 5:
                                          dep_1._M_dataplus._M_p = (pointer)&dep_1.field_2;
                                          pcVar1 = (__x->_M_dataplus)._M_p;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&dep_1,pcVar1,
                                                     pcVar1 + __x->_M_string_length);
                                          cmsys::SystemTools::ConvertToUnixSlashes(&dep_1);
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&depends,&dep_1);
                                          std::
                                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::
                                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                                    ((
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&dep,&implicit_depends_lang,&dep_1);
                                          std::
                                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::push_back(&implicit_depends.
                                                                                                              
                                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ,(
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&dep);
                                          std::
                                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~pair((
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&dep);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)dep_1._M_dataplus._M_p != &dep_1.field_2) {
                                            operator_delete(dep_1._M_dataplus._M_p,
                                                            dep_1.field_2._M_allocated_capacity + 1)
                                            ;
                                          }
                                          bVar4 = true;
                                          iVar14 = 4;
                                          break;
                                        case 6:
                                          std::__cxx11::string::_M_assign
                                                    ((string *)&main_dependency);
                                          bVar4 = true;
                                          iVar14 = 6;
                                          break;
                                        case 7:
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&output,&filename);
                                          bVar4 = true;
                                          iVar14 = 7;
                                          break;
                                        case 8:
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&outputs,&filename);
                                          bVar4 = true;
                                          iVar14 = 8;
                                          break;
                                        case 9:
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::push_back(&byproducts,&filename);
                                          bVar4 = true;
                                          iVar14 = 9;
                                          break;
                                        case 10:
                                          std::__cxx11::string::_M_assign((string *)&comment_buffer)
                                          ;
                                          bVar4 = true;
                                          iVar14 = 10;
                                          local_380 = comment_buffer._M_dataplus._M_p;
                                          break;
                                        case 0xb:
                                          std::__cxx11::string::_M_assign((string *)&working);
                                          bVar4 = true;
                                          iVar14 = 0xb;
                                          break;
                                        default:
                                          dep._M_dataplus._M_p = (pointer)&dep.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&dep,
                                                     "Wrong syntax. Unknown type of argument.","");
                                          cmCommand::SetError(&this->super_cmCommand,&dep);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)dep._M_dataplus._M_p != &dep.field_2) {
                                            operator_delete(dep._M_dataplus._M_p,
                                                            dep.field_2._M_allocated_capacity + 1);
                                          }
                                          bVar4 = false;
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)filename._M_dataplus._M_p != &filename.field_2) {
                                          operator_delete(filename._M_dataplus._M_p,
                                                          CONCAT71(filename.field_2.
                                                                   _M_allocated_capacity._1_7_,
                                                                   filename.field_2._M_local_buf[0])
                                                          + 1);
                                        }
                                        goto LAB_002600a0;
                                      }
                                      iVar14 = 10;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
LAB_00260063:
                      bVar4 = true;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_002600a0:
      if (!bVar4) break;
      uVar16 = (ulong)((int)uVar16 + 1);
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
      bVar6 = uVar16 < uVar15;
    } while (uVar16 < uVar15);
    bVar4 = (bool)(bVar5 ^ 1);
    uVar16 = local_278;
  }
  if (bVar6) goto LAB_002605ba;
  if ((currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &currentLine),
     pbVar3 = currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
     pbVar9 = currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     currentLine.
     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     currentLine.
     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    paVar17 = &(currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar17 + -1))->_M_dataplus)._M_p;
      if (paVar17 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2) {
        operator_delete(plVar2,paVar17->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar17 + 1);
      paVar17 = paVar17 + 2;
    } while (pbVar18 != pbVar3);
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
  }
  if ((output.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       output.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (target._M_string_length == 0)) {
    dep._M_dataplus._M_p = (pointer)&dep.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dep,"Wrong syntax. A TARGET or OUTPUT must be specified.","");
    cmCommand::SetError(&this->super_cmCommand,&dep);
LAB_0026059d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dep._M_dataplus._M_p != &dep.field_2) {
      operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((output.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         output.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((source._M_string_length == 0 && (target._M_string_length != 0)))) {
      dep._M_dataplus._M_p = (pointer)&dep.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dep,"Wrong syntax. A TARGET and OUTPUT can not both be specified.","");
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_0026059d;
    }
    if (!(bool)~bVar19 &&
        output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      dep._M_dataplus._M_p = (pointer)&dep.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dep,"given APPEND option with no OUTPUT.","");
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_0026059d;
    }
    bVar6 = CheckOutputs(this,&output);
    if (((bVar6) && (bVar6 = CheckOutputs(this,&outputs), bVar6)) &&
       (bVar6 = CheckOutputs(this,&byproducts), bVar6)) {
      if (!bVar19) {
        if (working._M_string_length != 0) {
          pcVar10 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          cmsys::SystemTools::CollapseFullPath(&dep,&working,pcVar10);
          std::__cxx11::string::operator=((string *)&working,(string *)&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
        }
        if ((source._M_string_length == 0) &&
           (output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          dep._M_dataplus._M_p = (pointer)0x0;
          dep._M_string_length = 0;
          dep.field_2._M_allocated_capacity = 0;
          cmMakefile::AddCustomCommandToTarget
                    ((this->super_cmCommand).Makefile,&target,&byproducts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dep,&commandLines,type,local_380,working._M_dataplus._M_p,bVar4,
                     SUB81(uVar16,0));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dep);
        }
        else {
          if (target._M_string_length != 0) {
            if (byproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                byproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if (uVar16 == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
                PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0050);
                if (PVar8 - NEW < 3) {
                  t = FATAL_ERROR;
                  bVar6 = true;
                  bVar19 = true;
                }
                else {
                  if (PVar8 == OLD) {
                    bVar6 = false;
                  }
                  else {
                    bVar6 = true;
                    if (PVar8 == WARN) {
                      cmPolicies::GetPolicyWarning_abi_cxx11_(&filename,(cmPolicies *)0x32,id);
                      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&dep,filename._M_dataplus._M_p,
                                           filename._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                      bVar6 = true;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)filename._M_dataplus._M_p != &filename.field_2) {
                        operator_delete(filename._M_dataplus._M_p,
                                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                                 filename.field_2._M_local_buf[0]) + 1);
                      }
                    }
                  }
                  bVar19 = false;
                  t = AUTHOR_WARNING;
                }
                if (bVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&dep,
                             "The SOURCE signatures of add_custom_command are no longer supported.",
                             0x44);
                  this_00 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::IssueMessage(this_00,t,&filename);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)filename._M_dataplus._M_p != &filename.field_2) {
                    operator_delete(filename._M_dataplus._M_p,
                                    CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                             filename.field_2._M_local_buf[0]) + 1);
                  }
                  if (bVar19) goto LAB_00260936;
                }
                cmMakefile::AddCustomCommandOldStyle
                          ((this->super_cmCommand).Makefile,&target,&outputs,&depends,&source,
                           &commandLines,local_380);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
                std::ios_base::~ios_base(local_138);
                goto LAB_00260cf6;
              }
              dep._M_dataplus._M_p = (pointer)&dep.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&dep,"USES_TERMINAL may not be used with SOURCE signatures","");
              cmCommand::SetError(&this->super_cmCommand,&dep);
            }
            else {
              dep._M_dataplus._M_p = (pointer)&dep.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&dep,"BYPRODUCTS may not be specified with SOURCE signatures","")
              ;
              cmCommand::SetError(&this->super_cmCommand,&dep);
            }
            goto LAB_0026059d;
          }
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&output,&byproducts,&depends,&main_dependency,
                     &commandLines,local_380,working._M_dataplus._M_p,false,bVar4,SUB81(uVar16,0));
          if (implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar11 = cmMakefile::GetSourceFileWithOutput
                                ((this->super_cmCommand).Makefile,
                                 output.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
            if (pcVar11 == (cmSourceFile *)0x0) {
              bVar6 = false;
            }
            else {
              pcVar12 = cmSourceFile::GetCustomCommand(pcVar11);
              bVar6 = pcVar12 != (cmCustomCommand *)0x0;
              if (bVar6) {
                bVar6 = true;
                cmCustomCommand::SetImplicitDepends(pcVar12,&implicit_depends);
              }
            }
            if (!bVar6) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dep,
                         "could not locate source file with a custom command producing \"",0x3e);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&dep,
                                   ((output.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                                   (output.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\" even though this command tried to create it!",0x2e);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&filename);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)filename._M_dataplus._M_p != &filename.field_2) {
                operator_delete(filename._M_dataplus._M_p,
                                CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                         filename.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
              std::ios_base::~ios_base(local_138);
              goto LAB_002605ba;
            }
          }
        }
LAB_00260cf6:
        bVar6 = true;
        goto LAB_002605bc;
      }
      pcVar11 = cmMakefile::GetSourceFileWithOutput
                          ((this->super_cmCommand).Makefile,
                           output.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      bVar19 = true;
      if (pcVar11 == (cmSourceFile *)0x0) {
        bVar6 = false;
      }
      else {
        pcVar12 = cmSourceFile::GetCustomCommand(pcVar11);
        bVar6 = pcVar12 != (cmCustomCommand *)0x0;
        if (bVar6) {
          cmCustomCommand::AppendCommands(pcVar12,&commandLines);
          cmCustomCommand::AppendDepends(pcVar12,&depends);
          cmCustomCommand::AppendImplicitDepends(pcVar12,&implicit_depends);
          bVar6 = true;
          bVar19 = false;
        }
      }
      if (!bVar19) goto LAB_002605bc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dep,"given APPEND option with output \"",0x21);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dep,
                           ((output.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                           (output.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"\" which is not already a custom command output.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&filename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
LAB_00260936:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
      std::ios_base::~ios_base(local_138);
    }
  }
LAB_002605ba:
  bVar6 = false;
LAB_002605bc:
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&implicit_depends.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)implicit_depends_lang._M_dataplus._M_p != &implicit_depends_lang.field_2) {
    operator_delete(implicit_depends_lang._M_dataplus._M_p,
                    CONCAT71(implicit_depends_lang.field_2._M_allocated_capacity._1_7_,
                             implicit_depends_lang.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working._M_dataplus._M_p != &working.field_2) {
    operator_delete(working._M_dataplus._M_p,
                    CONCAT71(working.field_2._M_allocated_capacity._1_7_,
                             working.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)main_dependency._M_dataplus._M_p != &main_dependency.field_2) {
    operator_delete(main_dependency._M_dataplus._M_p,
                    CONCAT71(main_dependency.field_2._M_allocated_capacity._1_7_,
                             main_dependency.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target._M_dataplus._M_p != &target.field_2) {
    operator_delete(target._M_dataplus._M_p,
                    CONCAT71(target.field_2._M_allocated_capacity._1_7_,
                             target.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,
                    CONCAT71(source.field_2._M_allocated_capacity._1_7_,
                             source.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool cmAddCustomCommandCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  /* Let's complain at the end of this function about the lack of a particular
     arg. For the moment, let's say that COMMAND, and either TARGET or SOURCE
     are required.
  */
  if (args.size() < 4)
    {
      this->SetError("called with wrong number of arguments.");
      return false;
    }

  std::string source, target, main_dependency, working;
  std::string comment_buffer;
  const char* comment = 0;
  std::vector<std::string> depends, outputs, output, byproducts;
  bool verbatim = false;
  bool append = false;
  bool uses_terminal = false;
  std::string implicit_depends_lang;
  cmCustomCommand::ImplicitDependsList implicit_depends;

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  cmTarget::CustomCommandType cctype = cmTarget::POST_BUILD;

  enum tdoing {
    doing_source,
    doing_command,
    doing_target,
    doing_depends,
    doing_implicit_depends_lang,
    doing_implicit_depends_file,
    doing_main_dependency,
    doing_output,
    doing_outputs,
    doing_byproducts,
    doing_comment,
    doing_working_directory,
    doing_nothing
  };

  tdoing doing = doing_nothing;

  for (unsigned int j = 0; j < args.size(); ++j)
    {
    std::string const& copy = args[j];

    if(copy == "SOURCE")
      {
      doing = doing_source;
      }
    else if(copy == "COMMAND")
      {
      doing = doing_command;

      // Save the current command before starting the next command.
      if(!currentLine.empty())
        {
        commandLines.push_back(currentLine);
        currentLine.clear();
        }
      }
    else if(copy == "PRE_BUILD")
      {
      cctype = cmTarget::PRE_BUILD;
      }
    else if(copy == "PRE_LINK")
      {
      cctype = cmTarget::PRE_LINK;
      }
    else if(copy == "POST_BUILD")
      {
      cctype = cmTarget::POST_BUILD;
      }
    else if(copy == "VERBATIM")
      {
      verbatim = true;
      }
    else if(copy == "APPEND")
      {
      append = true;
      }
    else if(copy == "USES_TERMINAL")
      {
      uses_terminal = true;
      }
    else if(copy == "TARGET")
      {
      doing = doing_target;
      }
    else if(copy == "ARGS")
      {
      // Ignore this old keyword.
      }
    else if (copy == "DEPENDS")
      {
      doing = doing_depends;
      }
    else if (copy == "OUTPUTS")
      {
      doing = doing_outputs;
      }
    else if (copy == "OUTPUT")
      {
      doing = doing_output;
      }
    else if (copy == "BYPRODUCTS")
      {
      doing = doing_byproducts;
      }
    else if (copy == "WORKING_DIRECTORY")
      {
      doing = doing_working_directory;
      }
    else if (copy == "MAIN_DEPENDENCY")
      {
      doing = doing_main_dependency;
      }
    else if (copy == "IMPLICIT_DEPENDS")
      {
      doing = doing_implicit_depends_lang;
      }
    else if (copy == "COMMENT")
      {
      doing = doing_comment;
      }
    else
      {
      std::string filename;
      switch (doing)
        {
        case doing_output:
        case doing_outputs:
        case doing_byproducts:
          if (!cmSystemTools::FileIsFullPath(copy.c_str()))
            {
            // This is an output to be generated, so it should be
            // under the build tree.  CMake 2.4 placed this under the
            // source tree.  However the only case that this change
            // will break is when someone writes
            //
            //   add_custom_command(OUTPUT out.txt ...)
            //
            // and later references "${CMAKE_CURRENT_SOURCE_DIR}/out.txt".
            // This is fairly obscure so we can wait for someone to
            // complain.
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
            }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          break;
        case doing_source:
          // We do not want to convert the argument to SOURCE because
          // that option is only available for backward compatibility.
          // Old-style use of this command may use the SOURCE==TARGET
          // trick which we must preserve.  If we convert the source
          // to a full path then it will no longer equal the target.
        default:
          break;
        }

      if (cmSystemTools::FileIsFullPath(filename.c_str()))
        {
        filename = cmSystemTools::CollapseFullPath(filename);
        }
       switch (doing)
         {
         case doing_working_directory:
           working = copy;
           break;
         case doing_source:
           source = copy;
           break;
         case doing_output:
           output.push_back(filename);
           break;
         case doing_main_dependency:
           main_dependency = copy;
           break;
         case doing_implicit_depends_lang:
           implicit_depends_lang = copy;
           doing = doing_implicit_depends_file;
           break;
         case doing_implicit_depends_file:
           {
           // An implicit dependency starting point is also an
           // explicit dependency.
           std::string dep = copy;
           cmSystemTools::ConvertToUnixSlashes(dep);
           depends.push_back(dep);

           // Add the implicit dependency language and file.
           cmCustomCommand::ImplicitDependsPair
             entry(implicit_depends_lang, dep);
           implicit_depends.push_back(entry);

           // Switch back to looking for a language.
           doing = doing_implicit_depends_lang;
           }
           break;
         case doing_command:
           currentLine.push_back(copy);
           break;
         case doing_target:
           target = copy;
           break;
         case doing_depends:
           {
           std::string dep = copy;
           cmSystemTools::ConvertToUnixSlashes(dep);
           depends.push_back(dep);
           }
           break;
         case doing_outputs:
           outputs.push_back(filename);
           break;
         case doing_byproducts:
           byproducts.push_back(filename);
           break;
         case doing_comment:
           comment_buffer = copy;
           comment = comment_buffer.c_str();
           break;
         default:
           this->SetError("Wrong syntax. Unknown type of argument.");
           return false;
         }
      }
    }

  // Store the last command line finished.
  if(!currentLine.empty())
    {
    commandLines.push_back(currentLine);
    currentLine.clear();
    }

  // At this point we could complain about the lack of arguments.  For
  // the moment, let's say that COMMAND, TARGET are always required.
  if(output.empty() && target.empty())
    {
    this->SetError("Wrong syntax. A TARGET or OUTPUT must be specified.");
    return false;
    }

  if(source.empty() && !target.empty() && !output.empty())
    {
    this->SetError(
      "Wrong syntax. A TARGET and OUTPUT can not both be specified.");
    return false;
    }
  if(append && output.empty())
    {
    this->SetError("given APPEND option with no OUTPUT.");
    return false;
    }

  // Make sure the output names and locations are safe.
  if(!this->CheckOutputs(output) ||
     !this->CheckOutputs(outputs) ||
     !this->CheckOutputs(byproducts))
    {
    return false;
    }

  // Check for an append request.
  if(append)
    {
    // Lookup an existing command.
    if(cmSourceFile* sf =
       this->Makefile->GetSourceFileWithOutput(output[0]))
      {
      if(cmCustomCommand* cc = sf->GetCustomCommand())
        {
        cc->AppendCommands(commandLines);
        cc->AppendDepends(depends);
        cc->AppendImplicitDepends(implicit_depends);
        return true;
        }
      }

    // No command for this output exists.
    std::ostringstream e;
    e << "given APPEND option with output \"" << output[0]
      << "\" which is not already a custom command output.";
    this->SetError(e.str());
    return false;
    }

  // Convert working directory to a full path.
  if(!working.empty())
    {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working = cmSystemTools::CollapseFullPath(working, build_dir);
    }

  // Choose which mode of the command to use.
  bool escapeOldStyle = !verbatim;
  if(source.empty() && output.empty())
    {
    // Source is empty, use the target.
    std::vector<std::string> no_depends;
    this->Makefile->AddCustomCommandToTarget(target, byproducts, no_depends,
                                             commandLines, cctype,
                                             comment, working.c_str(),
                                             escapeOldStyle, uses_terminal);
    }
  else if(target.empty())
    {
    // Target is empty, use the output.
    this->Makefile->AddCustomCommandToOutput(output, byproducts,
                                             depends, main_dependency,
                                             commandLines, comment,
                                             working.c_str(), false,
                                             escapeOldStyle, uses_terminal);

    // Add implicit dependency scanning requests if any were given.
    if(!implicit_depends.empty())
      {
      bool okay = false;
      if(cmSourceFile* sf =
         this->Makefile->GetSourceFileWithOutput(output[0]))
        {
        if(cmCustomCommand* cc = sf->GetCustomCommand())
          {
          okay = true;
          cc->SetImplicitDepends(implicit_depends);
          }
        }
      if(!okay)
        {
        std::ostringstream e;
        e << "could not locate source file with a custom command producing \""
          << output[0] << "\" even though this command tried to create it!";
        this->SetError(e.str());
        return false;
        }
      }
    }
  else if (!byproducts.empty())
    {
    this->SetError("BYPRODUCTS may not be specified with SOURCE signatures");
    return false;
    }
  else if (uses_terminal)
    {
    this->SetError("USES_TERMINAL may not be used with SOURCE signatures");
    return false;
    }
  else
    {
    bool issueMessage = true;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0050))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0050) << "\n";
      break;
    case cmPolicies::OLD:
      issueMessage = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      messageType = cmake::FATAL_ERROR;
      break;
    }

    if (issueMessage)
      {
      e << "The SOURCE signatures of add_custom_command are no longer "
           "supported.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }

    // Use the old-style mode for backward compatibility.
    this->Makefile->AddCustomCommandOldStyle(target, outputs, depends,
                                             source, commandLines,
                                             comment);
    }

  return true;
}